

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_db_status(sqlite3 *db,int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  ushort uVar1;
  void *pvVar2;
  long lVar3;
  Vdbe *p;
  LookasideSlot *pLVar4;
  LookasideSlot *pLVar5;
  Schema *pSVar6;
  _ht *p_Var7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  LookasideSlot *pLVar14;
  HashElem *pHVar15;
  Vdbe **ppVVar16;
  int nByte_1;
  u32 *local_58;
  int local_50;
  int nByte;
  int *local_48;
  ulong local_40;
  long local_38;
  
  local_58 = (u32 *)pHighwater;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  switch(op) {
  case 0:
    iVar13 = sqlite3LookasideUsed(db,(int *)local_58);
    *pCurrent = iVar13;
    iVar13 = 0;
    if (resetFlag != 0) {
      pLVar4 = (db->lookaside).pFree;
      pLVar5 = pLVar4;
      if (pLVar4 != (LookasideSlot *)0x0) {
        do {
          pLVar14 = pLVar5;
          pLVar5 = pLVar14->pNext;
        } while (pLVar5 != (LookasideSlot *)0x0);
        pLVar14->pNext = (db->lookaside).pInit;
        (db->lookaside).pInit = pLVar4;
        (db->lookaside).pFree = (LookasideSlot *)0x0;
      }
      pLVar4 = (db->lookaside).pSmallFree;
      pLVar5 = pLVar4;
      if (pLVar4 != (LookasideSlot *)0x0) {
        do {
          pLVar14 = pLVar5;
          pLVar5 = pLVar14->pNext;
        } while (pLVar5 != (LookasideSlot *)0x0);
        pLVar14->pNext = (db->lookaside).pSmallInit;
        (db->lookaside).pSmallInit = pLVar4;
        (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
      }
    }
    goto LAB_0011db9f;
  case 1:
  case 0xb:
    local_48 = pCurrent;
    sqlite3BtreeEnterAll(db);
    lVar12 = 8;
    iVar13 = 0;
    local_40 = (ulong)(uint)op;
    for (lVar11 = 0; lVar11 < db->nDb; lVar11 = lVar11 + 1) {
      lVar3 = *(long *)((long)&db->aDb->zDbSName + lVar12);
      if (lVar3 != 0) {
        pvVar2 = (void *)**(undefined8 **)(lVar3 + 8);
        iVar9 = *(int *)((long)pvVar2 + 200);
        uVar1 = *(ushort *)((long)pvVar2 + 0xb0);
        local_50 = iVar13;
        local_38 = lVar12;
        iVar13 = (*sqlite3Config.pcache2.xPagecount)
                           (*(sqlite3_pcache **)(*(long *)((long)pvVar2 + 0x120) + 0x48));
        iVar8 = (*sqlite3Config.m.xSize)(pvVar2);
        iVar13 = iVar8 + iVar13 * (iVar9 + (uint)uVar1 + 0x78) + *(int *)((long)pvVar2 + 200);
        if ((int)local_40 == 0xb) {
          iVar13 = iVar13 / *(int *)(*(long *)(lVar3 + 8) + 0x68);
        }
        iVar13 = local_50 + iVar13;
        lVar12 = local_38;
      }
      lVar12 = lVar12 + 0x20;
    }
    sqlite3BtreeLeaveAll(db);
    *local_48 = iVar13;
    *local_58 = 0;
    goto LAB_0011db9c;
  case 2:
    nByte_1 = 0;
    sqlite3BtreeEnterAll(db);
    db->pnBytesFreed = &nByte_1;
    (db->lookaside).pEnd = (db->lookaside).pStart;
    for (lVar12 = 0; lVar12 < db->nDb; lVar12 = lVar12 + 1) {
      pSVar6 = db->aDb[lVar12].pSchema;
      if (pSVar6 != (Schema *)0x0) {
        iVar13 = (*sqlite3Config.m.xRoundup)(0x20);
        nByte_1 = ((pSVar6->trigHash).count + (pSVar6->tblHash).count + (pSVar6->idxHash).count +
                  (pSVar6->fkeyHash).count) * iVar13 + nByte_1;
        p_Var7 = (pSVar6->tblHash).ht;
        iVar9 = 0;
        iVar13 = 0;
        if (p_Var7 != (_ht *)0x0) {
          iVar13 = (*sqlite3Config.m.xSize)(p_Var7);
        }
        nByte_1 = nByte_1 + iVar13;
        p_Var7 = (pSVar6->trigHash).ht;
        if (p_Var7 != (_ht *)0x0) {
          iVar9 = (*sqlite3Config.m.xSize)(p_Var7);
        }
        nByte_1 = nByte_1 + iVar9;
        p_Var7 = (pSVar6->idxHash).ht;
        iVar9 = 0;
        iVar13 = 0;
        if (p_Var7 != (_ht *)0x0) {
          iVar13 = (*sqlite3Config.m.xSize)(p_Var7);
        }
        nByte_1 = nByte_1 + iVar13;
        p_Var7 = (pSVar6->fkeyHash).ht;
        if (p_Var7 != (_ht *)0x0) {
          iVar9 = (*sqlite3Config.m.xSize)(p_Var7);
        }
        nByte_1 = nByte_1 + iVar9;
        pHVar15 = (HashElem *)&(pSVar6->trigHash).first;
        while (pHVar15 = pHVar15->next, pHVar15 != (HashElem *)0x0) {
          sqlite3DeleteTrigger(db,(Trigger *)pHVar15->data);
        }
        pHVar15 = (HashElem *)&(pSVar6->tblHash).first;
        while (pHVar15 = pHVar15->next, pHVar15 != (HashElem *)0x0) {
          sqlite3DeleteTable(db,(Table *)pHVar15->data);
        }
      }
    }
    db->pnBytesFreed = (int *)0x0;
    (db->lookaside).pEnd = (db->lookaside).pTrueEnd;
    sqlite3BtreeLeaveAll(db);
    *local_58 = 0;
    uVar10 = nByte_1;
    break;
  case 3:
    nByte = 0;
    db->pnBytesFreed = &nByte;
    (db->lookaside).pEnd = (db->lookaside).pStart;
    ppVVar16 = &db->pVdbe;
    while (p = *ppVVar16, p != (Vdbe *)0x0) {
      sqlite3VdbeDelete(p);
      ppVVar16 = &p->pVNext;
    }
    (db->lookaside).pEnd = (db->lookaside).pTrueEnd;
    db->pnBytesFreed = (int *)0x0;
    *local_58 = 0;
    uVar10 = nByte;
    break;
  case 4:
  case 5:
  case 6:
    *pCurrent = 0;
    *local_58 = (db->lookaside).anStat[op - 4U];
    iVar13 = 0;
    if (resetFlag != 0) {
      (db->lookaside).anStat[op - 4U] = 0;
    }
    goto LAB_0011db9f;
  case 10:
    *local_58 = 0;
    if (db->nDeferredImmCons < 1) {
      uVar10 = (uint)(0 < db->nDeferredCons);
    }
    else {
      uVar10 = 1;
    }
    break;
  case 0xc:
    op = 10;
  case 7:
  case 8:
  case 9:
    lVar12 = 8;
    iVar13 = 0;
    for (lVar11 = 0; lVar11 < db->nDb; lVar11 = lVar11 + 1) {
      lVar3 = *(long *)((long)&db->aDb->zDbSName + lVar12);
      if (lVar3 != 0) {
        lVar3 = **(long **)(lVar3 + 8);
        iVar13 = iVar13 + *(int *)(lVar3 + 0xf8 + (ulong)(op - 7) * 4);
        if (resetFlag != 0) {
          *(undefined4 *)(lVar3 + 0xf8 + (ulong)(op - 7) * 4) = 0;
        }
      }
      lVar12 = lVar12 + 0x20;
    }
    *local_58 = 0;
    *pCurrent = iVar13;
    goto LAB_0011db9c;
  default:
    iVar13 = 1;
    goto LAB_0011db9f;
  }
  *pCurrent = uVar10;
LAB_0011db9c:
  iVar13 = 0;
LAB_0011db9f:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar13;
}

Assistant:

SQLITE_API int sqlite3_db_status(
  sqlite3 *db,          /* The database connection whose status is desired */
  int op,               /* Status verb */
  int *pCurrent,        /* Write current value here */
  int *pHighwater,      /* Write high-water mark here */
  int resetFlag         /* Reset high-water mark if true */
){
  int rc = SQLITE_OK;   /* Return code */
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pCurrent==0|| pHighwater==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  switch( op ){
    case SQLITE_DBSTATUS_LOOKASIDE_USED: {
      *pCurrent = sqlite3LookasideUsed(db, pHighwater);
      if( resetFlag ){
        LookasideSlot *p = db->lookaside.pFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pInit;
          db->lookaside.pInit = db->lookaside.pFree;
          db->lookaside.pFree = 0;
        }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
        p = db->lookaside.pSmallFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pSmallInit;
          db->lookaside.pSmallInit = db->lookaside.pSmallFree;
          db->lookaside.pSmallFree = 0;
        }
#endif
      }
      break;
    }

    case SQLITE_DBSTATUS_LOOKASIDE_HIT:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL: {
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_HIT );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)>=0 );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)<3 );
      *pCurrent = 0;
      *pHighwater = db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT];
      if( resetFlag ){
        db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT] = 0;
      }
      break;
    }

    /*
    ** Return an approximation for the amount of memory currently used
    ** by all pagers associated with the given database connection.  The
    ** highwater mark is meaningless and is returned as zero.
    */
    case SQLITE_DBSTATUS_CACHE_USED_SHARED:
    case SQLITE_DBSTATUS_CACHE_USED: {
      int totalUsed = 0;
      int i;
      sqlite3BtreeEnterAll(db);
      for(i=0; i<db->nDb; i++){
        Btree *pBt = db->aDb[i].pBt;
        if( pBt ){
          Pager *pPager = sqlite3BtreePager(pBt);
          int nByte = sqlite3PagerMemUsed(pPager);
          if( op==SQLITE_DBSTATUS_CACHE_USED_SHARED ){
            nByte = nByte / sqlite3BtreeConnectionCount(pBt);
          }
          totalUsed += nByte;
        }
      }
      sqlite3BtreeLeaveAll(db);
      *pCurrent = totalUsed;
      *pHighwater = 0;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store the schema for all databases (main, temp, and any ATTACHed
    ** databases.  *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_SCHEMA_USED: {
      int i;                      /* Used to iterate through schemas */
      int nByte = 0;              /* Used to accumulate return value */

      sqlite3BtreeEnterAll(db);
      db->pnBytesFreed = &nByte;
      assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
      db->lookaside.pEnd = db->lookaside.pStart;
      for(i=0; i<db->nDb; i++){
        Schema *pSchema = db->aDb[i].pSchema;
        if( ALWAYS(pSchema!=0) ){
          HashElem *p;

          nByte += sqlite3GlobalConfig.m.xRoundup(sizeof(HashElem)) * (
              pSchema->tblHash.count
            + pSchema->trigHash.count
            + pSchema->idxHash.count
            + pSchema->fkeyHash.count
          );
          nByte += sqlite3_msize(pSchema->tblHash.ht);
          nByte += sqlite3_msize(pSchema->trigHash.ht);
          nByte += sqlite3_msize(pSchema->idxHash.ht);
          nByte += sqlite3_msize(pSchema->fkeyHash.ht);

          for(p=sqliteHashFirst(&pSchema->trigHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTrigger(db, (Trigger*)sqliteHashData(p));
          }
          for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTable(db, (Table *)sqliteHashData(p));
          }
        }
      }
      db->pnBytesFreed = 0;
      db->lookaside.pEnd = db->lookaside.pTrueEnd;
      sqlite3BtreeLeaveAll(db);

      *pHighwater = 0;
      *pCurrent = nByte;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store all prepared statements.
    ** *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_STMT_USED: {
      struct Vdbe *pVdbe;         /* Used to iterate through VMs */
      int nByte = 0;              /* Used to accumulate return value */

      db->pnBytesFreed = &nByte;
      assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
      db->lookaside.pEnd = db->lookaside.pStart;
      for(pVdbe=db->pVdbe; pVdbe; pVdbe=pVdbe->pVNext){
        sqlite3VdbeDelete(pVdbe);
      }
      db->lookaside.pEnd = db->lookaside.pTrueEnd;
      db->pnBytesFreed = 0;

      *pHighwater = 0;  /* IMP: R-64479-57858 */
      *pCurrent = nByte;

      break;
    }

    /*
    ** Set *pCurrent to the total cache hits or misses encountered by all
    ** pagers the database handle is connected to. *pHighwater is always set
    ** to zero.
    */
    case SQLITE_DBSTATUS_CACHE_SPILL:
      op = SQLITE_DBSTATUS_CACHE_WRITE+1;
      /* no break */ deliberate_fall_through
    case SQLITE_DBSTATUS_CACHE_HIT:
    case SQLITE_DBSTATUS_CACHE_MISS:
    case SQLITE_DBSTATUS_CACHE_WRITE:{
      int i;
      int nRet = 0;
      assert( SQLITE_DBSTATUS_CACHE_MISS==SQLITE_DBSTATUS_CACHE_HIT+1 );
      assert( SQLITE_DBSTATUS_CACHE_WRITE==SQLITE_DBSTATUS_CACHE_HIT+2 );

      for(i=0; i<db->nDb; i++){
        if( db->aDb[i].pBt ){
          Pager *pPager = sqlite3BtreePager(db->aDb[i].pBt);
          sqlite3PagerCacheStat(pPager, op, resetFlag, &nRet);
        }
      }
      *pHighwater = 0; /* IMP: R-42420-56072 */
                       /* IMP: R-54100-20147 */
                       /* IMP: R-29431-39229 */
      *pCurrent = nRet;
      break;
    }

    /* Set *pCurrent to non-zero if there are unresolved deferred foreign
    ** key constraints.  Set *pCurrent to zero if all foreign key constraints
    ** have been satisfied.  The *pHighwater is always set to zero.
    */
    case SQLITE_DBSTATUS_DEFERRED_FKS: {
      *pHighwater = 0;  /* IMP: R-11967-56545 */
      *pCurrent = db->nDeferredImmCons>0 || db->nDeferredCons>0;
      break;
    }

    default: {
      rc = SQLITE_ERROR;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}